

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

size_t __thiscall llama_context::state_write_data(llama_context *this,llama_io_write_i *io)

{
  int iVar1;
  uint32_t uVar2;
  value_type vVar3;
  char *__s;
  const_reference pvVar4;
  reference pvVar5;
  int *piVar6;
  unsigned_long *puVar7;
  size_t sVar8;
  long *in_RSI;
  llama_context *in_RDI;
  uint64_t embd_size;
  uint64_t logits_size;
  int32_t pos;
  size_t i;
  vector<int,_std::allocator<int>_> w_output_pos;
  vector<int,_std::allocator<int>_> *output_ids;
  int32_t n_outputs;
  string arch_str;
  undefined4 in_stack_ffffffffffffff18;
  llm_arch in_stack_ffffffffffffff1c;
  llama_io_write_i *in_stack_ffffffffffffff20;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffff28;
  uint uVar9;
  char *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  unsigned_long local_a8;
  size_t local_a0;
  unsigned_long local_98;
  llama_context *in_stack_ffffffffffffff70;
  llama_seq_id seq_id;
  llama_io_write_i *io_00;
  llama_kv_cache_unified *this_03;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> *local_50;
  int local_48 [4];
  string local_30 [4];
  
  this_01 = "state_write_data";
  uVar9 = 1;
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: writing state\n");
  llama_log_internal((ggml_log_level)(ulong)uVar9,"%s: - writing model info\n",this_01);
  __s = llm_arch_name(in_stack_ffffffffffffff1c);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffcf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,__s,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  llama_io_write_i::write_string
            (in_stack_ffffffffffffff20,
             (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::__cxx11::string::~string(local_30);
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing output ids\n","state_write_data");
  output_reorder(in_stack_ffffffffffffff70);
  local_48[0] = in_RDI->n_outputs;
  local_50 = &in_RDI->output_ids;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3df006);
  if (in_RDI->n_outputs_max < local_48[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
               ,0x7fb,"GGML_ASSERT(%s) failed","n_outputs <= n_outputs_max");
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_01,CONCAT44(uVar9,in_stack_ffffffffffffff28))
  ;
  local_70 = (vector<int,_std::allocator<int>_> *)0x0;
  do {
    this_00 = local_70;
    uVar2 = n_batch(in_RDI);
    if ((vector<int,_std::allocator<int>_> *)(ulong)uVar2 <= this_00) {
      (**(code **)(*in_RSI + 0x10))(in_RSI,local_48,4);
      if (local_48[0] != 0) {
        piVar6 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x3df1e0);
        (**(code **)(*in_RSI + 0x10))(in_RSI,piVar6,(long)local_48[0] << 2);
      }
      std::vector<int,_std::allocator<int>_>::~vector(this_00);
      llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing logits\n","state_write_data");
      io_00 = (llama_io_write_i *)in_RDI->logits_size;
      iVar1 = in_RDI->n_outputs;
      uVar2 = llama_vocab::n_tokens((llama_vocab *)0x3df253);
      seq_id = (llama_seq_id)((long)iVar1 * (ulong)uVar2 >> 0x20);
      puVar7 = std::min<unsigned_long>
                         ((unsigned_long *)&stack0xffffffffffffff78,
                          (unsigned_long *)&stack0xffffffffffffff70);
      this_03 = (llama_kv_cache_unified *)*puVar7;
      (**(code **)(*in_RSI + 0x10))(in_RSI,&stack0xffffffffffffff80,8);
      if (this_03 != (llama_kv_cache_unified *)0x0) {
        (**(code **)(*in_RSI + 0x10))(in_RSI,in_RDI->logits,(long)this_03 << 2);
      }
      llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing embeddings\n","state_write_data");
      local_a0 = in_RDI->embd_size;
      local_a8 = (long)in_RDI->n_outputs * (ulong)(in_RDI->model->hparams).n_embd;
      puVar7 = std::min<unsigned_long>(&local_a0,&local_a8);
      local_98 = *puVar7;
      (**(code **)(*in_RSI + 0x10))(in_RSI,&local_98,8);
      if (local_98 != 0) {
        (**(code **)(*in_RSI + 0x10))(in_RSI,in_RDI->embd,local_98 << 2);
      }
      llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing KV self\n","state_write_data");
      std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
      operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *
                 )0x3df384);
      llama_kv_cache_unified::state_write(this_03,io_00,seq_id);
      sVar8 = (**(code **)(*in_RSI + 0x20))();
      return sVar8;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(size_type)local_70);
    iVar1 = *pvVar4;
    if (-1 < iVar1) {
      if (local_48[0] <= iVar1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                   ,0x804,"GGML_ASSERT(%s) failed","pos < n_outputs");
      }
      vVar3 = (value_type)local_70;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)iVar1);
      *pvVar5 = vVar3;
    }
    local_70 = (vector<int,_std::allocator<int>_> *)
               ((long)&(local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

size_t llama_context::state_write_data(llama_io_write_i & io) {
    LLAMA_LOG_DEBUG("%s: writing state\n", __func__);

    // write model info
    {
        LLAMA_LOG_DEBUG("%s: - writing model info\n", __func__);

        const std::string arch_str = llm_arch_name(model.arch);
        io.write_string(arch_str);
        // TODO: add more model-specific info which should prevent loading the session file if not identical
    }

    // write output ids
    {
        LLAMA_LOG_DEBUG("%s: - writing output ids\n", __func__);

        output_reorder();

        const auto n_outputs    = this->n_outputs;
        const auto & output_ids = this->output_ids;

        std::vector<int32_t> w_output_pos;

        GGML_ASSERT(n_outputs <= n_outputs_max);

        w_output_pos.resize(n_outputs);

        // build a more compact representation of the output ids
        for (size_t i = 0; i < n_batch(); ++i) {
            // map an output id to a position in the batch
            int32_t pos = output_ids[i];
            if (pos >= 0) {
                GGML_ASSERT(pos < n_outputs);
                w_output_pos[pos] = i;
            }
        }

        io.write(&n_outputs, sizeof(n_outputs));

        if (n_outputs) {
            io.write(w_output_pos.data(), n_outputs * sizeof(int32_t));
        }
    }

    // write logits
    {
        LLAMA_LOG_DEBUG("%s: - writing logits\n", __func__);

        const uint64_t logits_size = std::min((uint64_t) this->logits_size, (uint64_t) n_outputs * model.vocab.n_tokens());

        io.write(&logits_size, sizeof(logits_size));

        if (logits_size) {
            io.write(logits, logits_size * sizeof(float));
        }
    }

    // write embeddings
    {
        LLAMA_LOG_DEBUG("%s: - writing embeddings\n", __func__);

        const uint64_t embd_size = std::min((uint64_t) this->embd_size, (uint64_t) n_outputs * model.hparams.n_embd);

        io.write(&embd_size, sizeof(embd_size));

        if (embd_size) {
            io.write(embd, embd_size * sizeof(float));
        }
    }

    LLAMA_LOG_DEBUG("%s: - writing KV self\n", __func__);
    kv_self->state_write(io);

    return io.n_bytes();
}